

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O0

bool __thiscall Point::operator<(Point *this,Point *b)

{
  bool bVar1;
  bool local_2a;
  bool local_29;
  Point *b_local;
  Point *this_local;
  
  bVar1 = operator==(this,b);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    bVar1 = float_lt(this->x,b->x);
    local_29 = true;
    if (!bVar1) {
      bVar1 = float_lt(b->x,this->x);
      local_2a = false;
      if (!bVar1) {
        local_2a = float_lt(this->y,b->y);
      }
      local_29 = local_2a;
    }
    this_local._7_1_ = local_29;
  }
  return this_local._7_1_;
}

Assistant:

bool Point::operator<(const Point &b) const {
    if (*this == b) {
        return false;
    }
    return float_lt(x,  b.x) || (!float_lt(b.x, x) && float_lt(y, b.y));
}